

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.c
# Opt level: O2

int print_keyword(yang_token keyword,yang_arg arg,FILE *out,int level,FILE *in,char **buf,
                 int *buf_len)

{
  char cVar1;
  int iVar2;
  bool bVar3;
  bool bVar4;
  char **buf_00;
  yang_token yVar5;
  int iVar6;
  char *pcVar7;
  char *pcVar8;
  char *pcVar9;
  char *pcVar10;
  FILE *pFVar11;
  uint uVar12;
  char *ptr;
  ulong uVar13;
  yang_arg local_54;
  int iStack_50;
  yang_arg arg_local;
  char **local_48;
  char *local_40;
  FILE *local_38;
  
  pFVar11 = _stderr;
  local_54 = arg;
  local_38 = (FILE *)out;
  if (0x44 < keyword - YANG_ANYXML) {
switchD_001032f2_caseD_24:
    pcVar10 = keyword2str(keyword);
    fprintf(pFVar11,"Unexpected keyword \"%s\".\n",pcVar10);
    return -1;
  }
  uVar13 = (ulong)(uint)level;
  pcVar10 = "text";
  _iStack_50 = CONCAT44(arg_local,arg);
  switch(keyword) {
  case YANG_ANYXML:
    pcVar9 = " ";
    if (level == 0) {
      pcVar9 = "";
    }
    pcVar10 = (char *)0x0;
    fprintf((FILE *)out,"%*s<anyxml name=\"",(ulong)(uint)(level * 2),pcVar9);
    bVar4 = true;
    pcVar9 = "anyxml";
    break;
  case YANG_ARGUMENT:
    pcVar9 = " ";
    if (level == 0) {
      pcVar9 = "";
    }
    pcVar10 = (char *)0x0;
    fprintf((FILE *)out,"%*s<argument name=\"",(ulong)(uint)(level * 2),pcVar9);
    bVar4 = true;
    pcVar9 = "argument";
    break;
  case YANG_AUGMENT:
    pcVar9 = " ";
    if (level == 0) {
      pcVar9 = "";
    }
    pcVar10 = (char *)0x0;
    fprintf((FILE *)out,"%*s<augment target-node=\"",(ulong)(uint)(level * 2),pcVar9);
    bVar4 = true;
    pcVar9 = "augment";
    break;
  case YANG_BASE:
    pcVar9 = " ";
    if (level == 0) {
      pcVar9 = "";
    }
    pcVar10 = (char *)0x0;
    fprintf((FILE *)out,"%*s<base name=\"",(ulong)(uint)(level * 2),pcVar9);
    bVar4 = true;
    pcVar9 = "base";
    break;
  case YANG_BELONGS_TO:
    pcVar9 = " ";
    if (level == 0) {
      pcVar9 = "";
    }
    pcVar10 = (char *)0x0;
    fprintf((FILE *)out,"%*s<belongs-to module=\"",(ulong)(uint)(level * 2),pcVar9);
    bVar4 = true;
    pcVar9 = "belongs-to";
    break;
  case YANG_BIT:
    pcVar9 = " ";
    if (level == 0) {
      pcVar9 = "";
    }
    pcVar10 = (char *)0x0;
    fprintf((FILE *)out,"%*s<bit name=\"",(ulong)(uint)(level * 2),pcVar9);
    bVar4 = true;
    pcVar9 = "bit";
    break;
  case YANG_CASE:
    pcVar9 = " ";
    if (level == 0) {
      pcVar9 = "";
    }
    pcVar10 = (char *)0x0;
    fprintf((FILE *)out,"%*s<case name=\"",(ulong)(uint)(level * 2),pcVar9);
    bVar4 = true;
    pcVar9 = "case";
    break;
  case YANG_CHOICE:
    pcVar9 = " ";
    if (level == 0) {
      pcVar9 = "";
    }
    pcVar10 = (char *)0x0;
    fprintf((FILE *)out,"%*s<choice name=\"",(ulong)(uint)(level * 2),pcVar9);
    bVar4 = true;
    pcVar9 = "choice";
    break;
  case YANG_CONFIG:
    pcVar9 = " ";
    if (level == 0) {
      pcVar9 = "";
    }
    pcVar10 = (char *)0x0;
    fprintf((FILE *)out,"%*s<config value=\"",(ulong)(uint)(level * 2),pcVar9);
    bVar4 = true;
    pcVar9 = "config";
    break;
  case YANG_CONTACT:
    local_40 = "contact";
    pcVar9 = "%*s<contact>\n";
    goto LAB_00103aa5;
  case YANG_CONTAINER:
    pcVar9 = " ";
    if (level == 0) {
      pcVar9 = "";
    }
    pcVar10 = (char *)0x0;
    fprintf((FILE *)out,"%*s<container name=\"",(ulong)(uint)(level * 2),pcVar9);
    bVar4 = true;
    pcVar9 = "container";
    break;
  case YANG_DEFAULT:
    pcVar9 = " ";
    if (level == 0) {
      pcVar9 = "";
    }
    pcVar10 = (char *)0x0;
    fprintf((FILE *)out,"%*s<default value=\"",(ulong)(uint)(level * 2),pcVar9);
    bVar4 = true;
    pcVar9 = "default";
    break;
  case YANG_DESCRIPTION:
    local_40 = "description";
    pcVar9 = "%*s<description>\n";
    goto LAB_00103aa5;
  case YANG_DEVIATE:
    pcVar9 = " ";
    if (level == 0) {
      pcVar9 = "";
    }
    pcVar10 = (char *)0x0;
    fprintf((FILE *)out,"%*s<deviate value=\"",(ulong)(uint)(level * 2),pcVar9);
    bVar4 = true;
    pcVar9 = "deviate";
    break;
  case YANG_DEVIATION:
    pcVar9 = " ";
    if (level == 0) {
      pcVar9 = "";
    }
    pcVar10 = (char *)0x0;
    fprintf((FILE *)out,"%*s<deviation target-node=\"",(ulong)(uint)(level * 2),pcVar9);
    bVar4 = true;
    pcVar9 = "deviation";
    break;
  case YANG_ENUM:
    pcVar9 = " ";
    if (level == 0) {
      pcVar9 = "";
    }
    pcVar10 = (char *)0x0;
    fprintf((FILE *)out,"%*s<enum name=\"",(ulong)(uint)(level * 2),pcVar9);
    bVar4 = true;
    pcVar9 = "enum";
    break;
  case YANG_ERROR_APP_TAG:
    pcVar9 = " ";
    if (level == 0) {
      pcVar9 = "";
    }
    pcVar10 = (char *)0x0;
    fprintf((FILE *)out,"%*s<error-app-tag value=\"",(ulong)(uint)(level * 2),pcVar9);
    bVar4 = true;
    pcVar9 = "error-app-tag";
    break;
  case YANG_ERROR_MESSAGE:
    local_40 = "error-message";
    pcVar10 = "value";
    pcVar9 = "%*s<error-message>\n";
    goto LAB_00103aa5;
  case YANG_EXTENSION:
    pcVar9 = " ";
    if (level == 0) {
      pcVar9 = "";
    }
    pcVar10 = (char *)0x0;
    fprintf((FILE *)out,"%*s<extension name=\"",(ulong)(uint)(level * 2),pcVar9);
    bVar4 = true;
    pcVar9 = "extension";
    break;
  case YANG_FEATURE:
    pcVar9 = " ";
    if (level == 0) {
      pcVar9 = "";
    }
    pcVar10 = (char *)0x0;
    fprintf((FILE *)out,"%*s<feature name=\"",(ulong)(uint)(level * 2),pcVar9);
    bVar4 = true;
    pcVar9 = "feature";
    break;
  case YANG_FRACTION_DIGITS:
    pcVar9 = " ";
    if (level == 0) {
      pcVar9 = "";
    }
    pcVar10 = (char *)0x0;
    fprintf((FILE *)out,"%*s<fraction-digits value=\"",(ulong)(uint)(level * 2),pcVar9);
    bVar4 = true;
    pcVar9 = "fraction-digits";
    break;
  case YANG_GROUPING:
    pcVar9 = " ";
    if (level == 0) {
      pcVar9 = "";
    }
    pcVar10 = (char *)0x0;
    fprintf((FILE *)out,"%*s<grouping name=\"",(ulong)(uint)(level * 2),pcVar9);
    bVar4 = true;
    pcVar9 = "grouping";
    break;
  case YANG_IDENTITY:
    pcVar9 = " ";
    if (level == 0) {
      pcVar9 = "";
    }
    pcVar10 = (char *)0x0;
    fprintf((FILE *)out,"%*s<identity name=\"",(ulong)(uint)(level * 2),pcVar9);
    bVar4 = true;
    pcVar9 = "identity";
    break;
  case YANG_IF_FEATURE:
    pcVar9 = " ";
    if (level == 0) {
      pcVar9 = "";
    }
    pcVar10 = (char *)0x0;
    fprintf((FILE *)out,"%*s<if-feature name=\"",(ulong)(uint)(level * 2),pcVar9);
    bVar4 = true;
    pcVar9 = "if-feature";
    break;
  case YANG_IMPORT:
    pcVar9 = " ";
    if (level == 0) {
      pcVar9 = "";
    }
    pcVar10 = (char *)0x0;
    fprintf((FILE *)out,"%*s<import module=\"",(ulong)(uint)(level * 2),pcVar9);
    bVar4 = true;
    pcVar9 = "import";
    break;
  case YANG_INCLUDE:
    pcVar9 = " ";
    if (level == 0) {
      pcVar9 = "";
    }
    pcVar10 = (char *)0x0;
    fprintf((FILE *)out,"%*s<include module=\"",(ulong)(uint)(level * 2),pcVar9);
    bVar4 = true;
    pcVar9 = "include";
    break;
  case YANG_INPUT:
    pcVar9 = " ";
    if (level == 0) {
      pcVar9 = "";
    }
    pcVar10 = (char *)0x0;
    fprintf((FILE *)out,"%*s<input",(ulong)(uint)(level * 2),pcVar9);
    bVar4 = true;
    pcVar9 = "input";
    break;
  case YANG_KEY:
    pcVar9 = " ";
    if (level == 0) {
      pcVar9 = "";
    }
    pcVar10 = (char *)0x0;
    fprintf((FILE *)out,"%*s<key value=\"",(ulong)(uint)(level * 2),pcVar9);
    bVar4 = true;
    pcVar9 = "key";
    break;
  case YANG_LEAF:
    pcVar9 = " ";
    if (level == 0) {
      pcVar9 = "";
    }
    pcVar10 = (char *)0x0;
    fprintf((FILE *)out,"%*s<leaf name=\"",(ulong)(uint)(level * 2),pcVar9);
    bVar4 = true;
    pcVar9 = "leaf";
    break;
  case YANG_LEAF_LIST:
    pcVar9 = " ";
    if (level == 0) {
      pcVar9 = "";
    }
    pcVar10 = (char *)0x0;
    fprintf((FILE *)out,"%*s<leaf-list name=\"",(ulong)(uint)(level * 2),pcVar9);
    bVar4 = true;
    pcVar9 = "leaf-list";
    break;
  case YANG_LENGTH:
    pcVar9 = " ";
    if (level == 0) {
      pcVar9 = "";
    }
    pcVar10 = (char *)0x0;
    fprintf((FILE *)out,"%*s<length value=\"",(ulong)(uint)(level * 2),pcVar9);
    bVar4 = true;
    pcVar9 = "length";
    break;
  case YANG_LIST:
    pcVar9 = " ";
    if (level == 0) {
      pcVar9 = "";
    }
    pcVar10 = (char *)0x0;
    fprintf((FILE *)out,"%*s<list name=\"",(ulong)(uint)(level * 2),pcVar9);
    bVar4 = true;
    pcVar9 = "list";
    break;
  case YANG_MANDATORY:
    pcVar9 = " ";
    if (level == 0) {
      pcVar9 = "";
    }
    pcVar10 = (char *)0x0;
    fprintf((FILE *)out,"%*s<mandatory value=\"",(ulong)(uint)(level * 2),pcVar9);
    bVar4 = true;
    pcVar9 = "mandatory";
    break;
  case YANG_MAX_ELEMENTS:
    pcVar9 = " ";
    if (level == 0) {
      pcVar9 = "";
    }
    pcVar10 = (char *)0x0;
    fprintf((FILE *)out,"%*s<max-elements value=\"",(ulong)(uint)(level * 2),pcVar9);
    bVar4 = true;
    pcVar9 = "max-elements";
    break;
  case YANG_MIN_ELEMENTS:
    pcVar9 = " ";
    if (level == 0) {
      pcVar9 = "";
    }
    pcVar10 = (char *)0x0;
    fprintf((FILE *)out,"%*s<min-elements value=\"",(ulong)(uint)(level * 2),pcVar9);
    bVar4 = true;
    pcVar9 = "min-elements";
    break;
  default:
    goto switchD_001032f2_caseD_24;
  case YANG_MUST:
    pcVar9 = " ";
    if (level == 0) {
      pcVar9 = "";
    }
    pcVar10 = (char *)0x0;
    fprintf((FILE *)out,"%*s<must condition=\"",(ulong)(uint)(level * 2),pcVar9);
    bVar4 = true;
    pcVar9 = "must";
    break;
  case YANG_NAMESPACE:
    pcVar9 = " ";
    if (level == 0) {
      pcVar9 = "";
    }
    pcVar10 = (char *)0x0;
    fprintf((FILE *)out,"%*s<namespace uri=\"",(ulong)(uint)(level * 2),pcVar9);
    bVar4 = true;
    pcVar9 = "namespace";
    break;
  case YANG_NOTIFICATION:
    pcVar9 = " ";
    if (level == 0) {
      pcVar9 = "";
    }
    pcVar10 = (char *)0x0;
    fprintf((FILE *)out,"%*s<notification name=\"",(ulong)(uint)(level * 2),pcVar9);
    bVar4 = true;
    pcVar9 = "notification";
    break;
  case YANG_ORDERED_BY:
    pcVar9 = " ";
    if (level == 0) {
      pcVar9 = "";
    }
    pcVar10 = (char *)0x0;
    fprintf((FILE *)out,"%*s<ordered-by value=\"",(ulong)(uint)(level * 2),pcVar9);
    bVar4 = true;
    pcVar9 = "ordered-by";
    break;
  case YANG_ORGANIZATION:
    local_40 = "organization";
    pcVar9 = "%*s<organization>\n";
    goto LAB_00103aa5;
  case YANG_OUTPUT:
    pcVar9 = " ";
    if (level == 0) {
      pcVar9 = "";
    }
    pcVar10 = (char *)0x0;
    fprintf((FILE *)out,"%*s<output",(ulong)(uint)(level * 2),pcVar9);
    bVar4 = true;
    pcVar9 = "output";
    break;
  case YANG_PATH:
    pcVar9 = " ";
    if (level == 0) {
      pcVar9 = "";
    }
    pcVar10 = (char *)0x0;
    fprintf((FILE *)out,"%*s<path value=\"",(ulong)(uint)(level * 2),pcVar9);
    bVar4 = true;
    pcVar9 = "path";
    break;
  case YANG_PATTERN:
    pcVar9 = " ";
    if (level == 0) {
      pcVar9 = "";
    }
    pcVar10 = (char *)0x0;
    fprintf((FILE *)out,"%*s<pattern value=\"",(ulong)(uint)(level * 2),pcVar9);
    bVar4 = true;
    pcVar9 = "pattern";
    break;
  case YANG_POSITION:
    pcVar9 = " ";
    if (level == 0) {
      pcVar9 = "";
    }
    pcVar7 = "%*s<position value=\"";
    goto LAB_001037cc;
  case YANG_PREFIX:
    pcVar9 = " ";
    if (level == 0) {
      pcVar9 = "";
    }
    pcVar10 = (char *)0x0;
    fprintf((FILE *)out,"%*s<prefix value=\"",(ulong)(uint)(level * 2),pcVar9);
    bVar4 = true;
    pcVar9 = "prefix";
    break;
  case YANG_PRESENCE:
    pcVar9 = " ";
    if (level == 0) {
      pcVar9 = "";
    }
    pcVar10 = (char *)0x0;
    fprintf((FILE *)out,"%*s<presence value=\"",(ulong)(uint)(level * 2),pcVar9);
    bVar4 = true;
    pcVar9 = "presence";
    break;
  case YANG_RANGE:
    pcVar9 = " ";
    if (level == 0) {
      pcVar9 = "";
    }
    pcVar10 = (char *)0x0;
    fprintf((FILE *)out,"%*s<range value=\"",(ulong)(uint)(level * 2),pcVar9);
    bVar4 = true;
    pcVar9 = "range";
    break;
  case YANG_REFERENCE:
    local_40 = "reference";
    pcVar9 = "%*s<reference>\n";
LAB_00103aa5:
    pcVar7 = " ";
    if (level == 0) {
      pcVar7 = "";
    }
    local_48 = buf;
    fprintf((FILE *)out,pcVar9,(ulong)(uint)(level * 2),pcVar7);
    uVar12 = level + 1;
    uVar13 = (ulong)uVar12;
    pcVar9 = " ";
    if (uVar12 == 0) {
      pcVar9 = "";
    }
    bVar4 = false;
    fprintf((FILE *)out,"%*s<%s>",(ulong)(uVar12 * 2),pcVar9,pcVar10);
    pcVar9 = local_40;
    buf = local_48;
    break;
  case YANG_REFINE:
    pcVar9 = " ";
    if (level == 0) {
      pcVar9 = "";
    }
    pcVar10 = (char *)0x0;
    fprintf((FILE *)out,"%*s<refine target-node=\"",(ulong)(uint)(level * 2),pcVar9);
    bVar4 = true;
    pcVar9 = "refine";
    break;
  case YANG_REQUIRE_INSTANCE:
    pcVar9 = " ";
    if (level == 0) {
      pcVar9 = "";
    }
    pcVar10 = (char *)0x0;
    fprintf((FILE *)out,"%*s<require-instance value=\"",(ulong)(uint)(level * 2),pcVar9);
    bVar4 = true;
    pcVar9 = "require-instance";
    break;
  case YANG_REVISION:
    pcVar9 = " ";
    if (level == 0) {
      pcVar9 = "";
    }
    pcVar10 = (char *)0x0;
    fprintf((FILE *)out,"%*s<revision date=\"",(ulong)(uint)(level * 2),pcVar9);
    bVar4 = true;
    pcVar9 = "revision";
    break;
  case YANG_REVISION_DATE:
    pcVar9 = " ";
    if (level == 0) {
      pcVar9 = "";
    }
    pcVar10 = (char *)0x0;
    fprintf((FILE *)out,"%*s<revision-date date=\"",(ulong)(uint)(level * 2),pcVar9);
    bVar4 = true;
    pcVar9 = "revision-date";
    break;
  case YANG_RPC:
    pcVar9 = " ";
    if (level == 0) {
      pcVar9 = "";
    }
    pcVar10 = (char *)0x0;
    fprintf((FILE *)out,"%*s<rpc name=\"",(ulong)(uint)(level * 2),pcVar9);
    bVar4 = true;
    pcVar9 = "rpc";
    break;
  case YANG_STATUS:
    pcVar9 = " ";
    if (level == 0) {
      pcVar9 = "";
    }
    pcVar10 = (char *)0x0;
    fprintf((FILE *)out,"%*s<status value=\"",(ulong)(uint)(level * 2),pcVar9);
    bVar4 = true;
    pcVar9 = "status";
    break;
  case YANG_TYPE:
    pcVar9 = " ";
    if (level == 0) {
      pcVar9 = "";
    }
    pcVar10 = (char *)0x0;
    fprintf((FILE *)out,"%*s<type name=\"",(ulong)(uint)(level * 2),pcVar9);
    bVar4 = true;
    pcVar9 = "type";
    break;
  case YANG_TYPEDEF:
    pcVar9 = " ";
    if (level == 0) {
      pcVar9 = "";
    }
    pcVar10 = (char *)0x0;
    fprintf((FILE *)out,"%*s<typedef name=\"",(ulong)(uint)(level * 2),pcVar9);
    bVar4 = true;
    pcVar9 = "typedef";
    break;
  case YANG_UNIQUE:
    pcVar9 = " ";
    if (level == 0) {
      pcVar9 = "";
    }
    pcVar10 = (char *)0x0;
    fprintf((FILE *)out,"%*s<unique tag=\"",(ulong)(uint)(level * 2),pcVar9);
    bVar4 = true;
    pcVar9 = "unique";
    break;
  case YANG_UNITS:
    pcVar9 = " ";
    if (level == 0) {
      pcVar9 = "";
    }
    pcVar10 = (char *)0x0;
    fprintf((FILE *)out,"%*s<units name=\"",(ulong)(uint)(level * 2),pcVar9);
    bVar4 = true;
    pcVar9 = "units";
    break;
  case YANG_USES:
    pcVar9 = " ";
    if (level == 0) {
      pcVar9 = "";
    }
    pcVar10 = (char *)0x0;
    fprintf((FILE *)out,"%*s<uses name=\"",(ulong)(uint)(level * 2),pcVar9);
    bVar4 = true;
    pcVar9 = "uses";
    break;
  case YANG_VALUE:
    pcVar9 = " ";
    if (level == 0) {
      pcVar9 = "";
    }
    pcVar7 = "%*s<value value=\"";
LAB_001037cc:
    pcVar10 = (char *)0x0;
    fprintf((FILE *)out,pcVar7,(ulong)(uint)(level * 2),pcVar9);
    bVar4 = true;
    pcVar9 = "value";
    break;
  case YANG_WHEN:
    pcVar9 = " ";
    if (level == 0) {
      pcVar9 = "";
    }
    pcVar10 = (char *)0x0;
    fprintf((FILE *)out,"%*s<when condition=\"",(ulong)(uint)(level * 2),pcVar9);
    bVar4 = true;
    pcVar9 = "condition";
    break;
  case YANG_YANG_VERSION:
    pcVar9 = " ";
    if (level == 0) {
      pcVar9 = "";
    }
    pcVar10 = (char *)0x0;
    fprintf((FILE *)out,"%*s<yang-version value=\"",(ulong)(uint)(level * 2),pcVar9);
    bVar4 = true;
    pcVar9 = "yang-version";
    break;
  case YANG_YIN_ELEMENT:
    pcVar9 = " ";
    if (level == 0) {
      pcVar9 = "";
    }
    pcVar10 = (char *)0x0;
    fprintf((FILE *)out,"%*s<yin-element value=\"",(ulong)(uint)(level * 2),pcVar9);
    bVar4 = true;
    pcVar9 = "yin-element";
    break;
  case YANG_CUSTOM:
    pcVar9 = " ";
    if (level == 0) {
      pcVar9 = "";
    }
    pcVar10 = (char *)0x0;
    fprintf((FILE *)out,"%*s<%s",(ulong)(uint)(level * 2),pcVar9,*buf);
    bVar4 = true;
    pcVar9 = "!!error!!";
  }
  if (iStack_50 == 2) {
    local_40 = pcVar9;
    pcVar9 = get_word(in,buf,buf_len);
    if (pcVar9 != (char *)0x0) {
      _iStack_50 = uVar13;
      local_48 = buf;
      if (!bVar4) {
        do {
          cVar1 = *pcVar9;
          if (cVar1 == '&') {
            pcVar7 = "&amp;";
LAB_00103c60:
            fputs(pcVar7,local_38);
          }
          else {
            if (cVar1 == '<') {
              pcVar7 = "&lt;";
              goto LAB_00103c60;
            }
            if (cVar1 == '>') {
              pcVar7 = "&gt;";
              goto LAB_00103c60;
            }
            if (cVar1 == '\0') goto LAB_00103c6e;
            fputc((int)cVar1,local_38);
          }
          pcVar9 = pcVar9 + 1;
        } while( true );
      }
      do {
        cVar1 = *pcVar9;
        if (cVar1 == '\"') {
          pcVar7 = "&quot;";
LAB_00103c08:
          fputs(pcVar7,local_38);
        }
        else {
          if (cVar1 == '&') {
            pcVar7 = "&amp;";
            goto LAB_00103c08;
          }
          if (cVar1 == '<') {
            pcVar7 = "&lt;";
            goto LAB_00103c08;
          }
          if (cVar1 == '>') {
            pcVar7 = "&gt;";
            goto LAB_00103c08;
          }
          if (cVar1 == '\0') goto LAB_00103c6e;
          fputc((int)cVar1,local_38);
        }
        pcVar9 = pcVar9 + 1;
      } while( true );
    }
  }
  else {
    if (iStack_50 == 1) {
      _iStack_50 = uVar13;
      pcVar7 = get_word(in,buf,buf_len);
      if (pcVar7 == (char *)0x0) {
        return -1;
      }
      pcVar8 = "\"";
      if (!bVar4) {
        pcVar8 = "";
      }
      fprintf(local_38,"%s%s",pcVar7,pcVar8);
      uVar13 = _iStack_50;
    }
    bVar3 = true;
    local_48 = buf;
    local_40 = pcVar9;
    if (!bVar4) {
LAB_00103c8d:
      bVar3 = false;
      fprintf(local_38,"</%s>\n",pcVar10);
      uVar13 = (ulong)((int)uVar13 - 1);
    }
LAB_00103ca5:
    pcVar10 = get_word(in,local_48,buf_len);
    if (pcVar10 != (char *)0x0) {
      _iStack_50 = uVar13;
      yVar5 = get_keyword(pcVar10,&local_54);
      pFVar11 = _stderr;
      if (yVar5 == YANG_SEMICOLON) {
        if (bVar3) {
          fwrite("/>\n",3,1,local_38);
          return 0;
        }
LAB_00103dbc:
        pcVar10 = " ";
        if ((int)_iStack_50 == 0) {
          pcVar10 = "";
        }
        fprintf(local_38,"%*s</%s>\n",(ulong)(uint)((int)_iStack_50 * 2),pcVar10,local_40);
        return 0;
      }
      if (yVar5 == YANG_LEFT_BRACE) {
        if (bVar3) {
          fwrite(">\n",2,1,local_38);
        }
        buf_00 = local_48;
        iVar2 = (int)_iStack_50;
        do {
          pcVar10 = get_word(in,buf_00,buf_len);
          if (pcVar10 == (char *)0x0) {
            return -1;
          }
          yVar5 = get_keyword(pcVar10,&local_54);
          if (yVar5 == YANG_RIGHT_BRACE) goto LAB_00103dbc;
          if (yVar5 == YANG_UNKNOWN) {
            pcVar9 = "Unexpected characters (\"%.20s\"...).\n";
            pFVar11 = _stderr;
            goto LAB_00104231;
          }
          iVar6 = print_keyword(yVar5,local_54,(FILE *)local_38,iVar2 + 1,in,buf_00,buf_len);
        } while (iVar6 == 0);
      }
      else {
        if (yVar5 == YANG_RIGHT_BRACE) {
          return 0;
        }
        if (yVar5 == YANG_UNKNOWN) {
          pcVar9 = "Unexpected characters (\"%.20s\"...).\n";
        }
        else {
          pcVar10 = keyword2str(yVar5);
          pcVar9 = "Unexpected keyword \"%s\".\n";
        }
LAB_00104231:
        fprintf(pFVar11,pcVar9,pcVar10);
      }
    }
  }
  return -1;
LAB_00103c6e:
  uVar13 = _iStack_50;
  if (!bVar4) goto LAB_00103c8d;
  fputc(0x22,local_38);
  bVar3 = true;
  goto LAB_00103ca5;
}

Assistant:

static int
print_keyword(enum yang_token keyword, enum yang_arg arg, FILE *out, int level, FILE *in, char **buf, int *buf_len)
{
    char *word;
    const char *yin_element = NULL, *close_tag;

    switch (keyword) {
    case YANG_ANYXML:
        fprintf(out, "%*s<anyxml name=\"", LEVEL(level), INDENT(level));
        close_tag = "anyxml";
        break;
    case YANG_ARGUMENT:
        fprintf(out, "%*s<argument name=\"", LEVEL(level), INDENT(level));
        close_tag = "argument";
        break;
    case YANG_AUGMENT:
        fprintf(out, "%*s<augment target-node=\"", LEVEL(level), INDENT(level));
        close_tag = "augment";
        break;
    case YANG_BASE:
        fprintf(out, "%*s<base name=\"", LEVEL(level), INDENT(level));
        close_tag = "base";
        break;
    case YANG_BELONGS_TO:
        fprintf(out, "%*s<belongs-to module=\"", LEVEL(level), INDENT(level));
        close_tag = "belongs-to";
        break;
    case YANG_BIT:
        fprintf(out, "%*s<bit name=\"", LEVEL(level), INDENT(level));
        close_tag = "bit";
        break;
    case YANG_CASE:
        fprintf(out, "%*s<case name=\"", LEVEL(level), INDENT(level));
        close_tag = "case";
        break;
    case YANG_CHOICE:
        fprintf(out, "%*s<choice name=\"", LEVEL(level), INDENT(level));
        close_tag = "choice";
        break;
    case YANG_CONFIG:
        fprintf(out, "%*s<config value=\"", LEVEL(level), INDENT(level));
        close_tag = "config";
        break;
    case YANG_CONTACT:
        fprintf(out, "%*s<contact>\n", LEVEL(level), INDENT(level));
        yin_element = "text";
        close_tag = "contact";
        break;
    case YANG_CONTAINER:
        fprintf(out, "%*s<container name=\"", LEVEL(level), INDENT(level));
        close_tag = "container";
        break;
    case YANG_DEFAULT:
        fprintf(out, "%*s<default value=\"", LEVEL(level), INDENT(level));
        close_tag = "default";
        break;
    case YANG_DESCRIPTION:
        fprintf(out, "%*s<description>\n", LEVEL(level), INDENT(level));
        yin_element = "text";
        close_tag = "description";
        break;
    case YANG_DEVIATE:
        fprintf(out, "%*s<deviate value=\"", LEVEL(level), INDENT(level));
        close_tag = "deviate";
        break;
    case YANG_DEVIATION:
        fprintf(out, "%*s<deviation target-node=\"", LEVEL(level), INDENT(level));
        close_tag = "deviation";
        break;
    case YANG_ENUM:
        fprintf(out, "%*s<enum name=\"", LEVEL(level), INDENT(level));
        close_tag = "enum";
        break;
    case YANG_ERROR_APP_TAG:
        fprintf(out, "%*s<error-app-tag value=\"", LEVEL(level), INDENT(level));
        close_tag = "error-app-tag";
        break;
    case YANG_ERROR_MESSAGE:
        fprintf(out, "%*s<error-message>\n", LEVEL(level), INDENT(level));
        yin_element = "value";
        close_tag = "error-message";
        break;
    case YANG_EXTENSION:
        fprintf(out, "%*s<extension name=\"", LEVEL(level), INDENT(level));
        close_tag = "extension";
        break;
    case YANG_FEATURE:
        fprintf(out, "%*s<feature name=\"", LEVEL(level), INDENT(level));
        close_tag = "feature";
        break;
    case YANG_FRACTION_DIGITS:
        fprintf(out, "%*s<fraction-digits value=\"", LEVEL(level), INDENT(level));
        close_tag = "fraction-digits";
        break;
    case YANG_GROUPING:
        fprintf(out, "%*s<grouping name=\"", LEVEL(level), INDENT(level));
        close_tag = "grouping";
        break;
    case YANG_IDENTITY:
        fprintf(out, "%*s<identity name=\"", LEVEL(level), INDENT(level));
        close_tag = "identity";
        break;
    case YANG_IF_FEATURE:
        fprintf(out, "%*s<if-feature name=\"", LEVEL(level), INDENT(level));
        close_tag = "if-feature";
        break;
    case YANG_IMPORT:
        fprintf(out, "%*s<import module=\"", LEVEL(level), INDENT(level));
        close_tag = "import";
        break;
    case YANG_INCLUDE:
        fprintf(out, "%*s<include module=\"", LEVEL(level), INDENT(level));
        close_tag = "include";
        break;
    case YANG_INPUT:
        fprintf(out, "%*s<input", LEVEL(level), INDENT(level));
        close_tag = "input";
        break;
    case YANG_KEY:
        fprintf(out, "%*s<key value=\"", LEVEL(level), INDENT(level));
        close_tag = "key";
        break;
    case YANG_LEAF:
        fprintf(out, "%*s<leaf name=\"", LEVEL(level), INDENT(level));
        close_tag = "leaf";
        break;
    case YANG_LEAF_LIST:
        fprintf(out, "%*s<leaf-list name=\"", LEVEL(level), INDENT(level));
        close_tag = "leaf-list";
        break;
    case YANG_LENGTH:
        fprintf(out, "%*s<length value=\"", LEVEL(level), INDENT(level));
        close_tag = "length";
        break;
    case YANG_LIST:
        fprintf(out, "%*s<list name=\"", LEVEL(level), INDENT(level));
        close_tag = "list";
        break;
    case YANG_MANDATORY:
        fprintf(out, "%*s<mandatory value=\"", LEVEL(level), INDENT(level));
        close_tag = "mandatory";
        break;
    case YANG_MAX_ELEMENTS:
        fprintf(out, "%*s<max-elements value=\"", LEVEL(level), INDENT(level));
        close_tag = "max-elements";
        break;
    case YANG_MIN_ELEMENTS:
        fprintf(out, "%*s<min-elements value=\"", LEVEL(level), INDENT(level));
        close_tag = "min-elements";
        break;
    case YANG_MUST:
        fprintf(out, "%*s<must condition=\"", LEVEL(level), INDENT(level));
        close_tag = "must";
        break;
    case YANG_NAMESPACE:
        fprintf(out, "%*s<namespace uri=\"", LEVEL(level), INDENT(level));
        close_tag = "namespace";
        break;
    case YANG_NOTIFICATION:
        fprintf(out, "%*s<notification name=\"", LEVEL(level), INDENT(level));
        close_tag = "notification";
        break;
    case YANG_ORDERED_BY:
        fprintf(out, "%*s<ordered-by value=\"", LEVEL(level), INDENT(level));
        close_tag = "ordered-by";
        break;
    case YANG_ORGANIZATION:
        fprintf(out, "%*s<organization>\n", LEVEL(level), INDENT(level));
        yin_element = "text";
        close_tag = "organization";
        break;
    case YANG_OUTPUT:
        fprintf(out, "%*s<output", LEVEL(level), INDENT(level));
        close_tag = "output";
        break;
    case YANG_PATH:
        fprintf(out, "%*s<path value=\"", LEVEL(level), INDENT(level));
        close_tag = "path";
        break;
    case YANG_PATTERN:
        fprintf(out, "%*s<pattern value=\"", LEVEL(level), INDENT(level));
        close_tag = "pattern";
        break;
    case YANG_POSITION:
        fprintf(out, "%*s<position value=\"", LEVEL(level), INDENT(level));
        close_tag = "value";
        break;
    case YANG_PREFIX:
        fprintf(out, "%*s<prefix value=\"", LEVEL(level), INDENT(level));
        close_tag = "prefix";
        break;
    case YANG_PRESENCE:
        fprintf(out, "%*s<presence value=\"", LEVEL(level), INDENT(level));
        close_tag = "presence";
        break;
    case YANG_RANGE:
        fprintf(out, "%*s<range value=\"", LEVEL(level), INDENT(level));
        close_tag = "range";
        break;
    case YANG_REFERENCE:
        fprintf(out, "%*s<reference>\n", LEVEL(level), INDENT(level));
        yin_element = "text";
        close_tag = "reference";
        break;
    case YANG_REFINE:
        fprintf(out, "%*s<refine target-node=\"", LEVEL(level), INDENT(level));
        close_tag = "refine";
        break;
    case YANG_REQUIRE_INSTANCE:
        fprintf(out, "%*s<require-instance value=\"", LEVEL(level), INDENT(level));
        close_tag = "require-instance";
        break;
    case YANG_REVISION:
        fprintf(out, "%*s<revision date=\"", LEVEL(level), INDENT(level));
        close_tag = "revision";
        break;
    case YANG_REVISION_DATE:
        fprintf(out, "%*s<revision-date date=\"", LEVEL(level), INDENT(level));
        close_tag = "revision-date";
        break;
    case YANG_RPC:
        fprintf(out, "%*s<rpc name=\"", LEVEL(level), INDENT(level));
        close_tag = "rpc";
        break;
    case YANG_STATUS:
        fprintf(out, "%*s<status value=\"", LEVEL(level), INDENT(level));
        close_tag = "status";
        break;
    case YANG_TYPE:
        fprintf(out, "%*s<type name=\"", LEVEL(level), INDENT(level));
        close_tag = "type";
        break;
    case YANG_TYPEDEF:
        fprintf(out, "%*s<typedef name=\"", LEVEL(level), INDENT(level));
        close_tag = "typedef";
        break;
    case YANG_UNIQUE:
        fprintf(out, "%*s<unique tag=\"", LEVEL(level), INDENT(level));
        close_tag = "unique";
        break;
    case YANG_UNITS:
        fprintf(out, "%*s<units name=\"", LEVEL(level), INDENT(level));
        close_tag = "units";
        break;
    case YANG_USES:
        fprintf(out, "%*s<uses name=\"", LEVEL(level), INDENT(level));
        close_tag = "uses";
        break;
    case YANG_VALUE:
        fprintf(out, "%*s<value value=\"", LEVEL(level), INDENT(level));
        close_tag = "value";
        break;
    case YANG_WHEN:
        fprintf(out, "%*s<when condition=\"", LEVEL(level), INDENT(level));
        close_tag = "condition";
        break;
    case YANG_YANG_VERSION:
        fprintf(out, "%*s<yang-version value=\"", LEVEL(level), INDENT(level));
        close_tag = "yang-version";
        break;
    case YANG_YIN_ELEMENT:
        fprintf(out, "%*s<yin-element value=\"", LEVEL(level), INDENT(level));
        close_tag = "yin-element";
        break;
    case YANG_CUSTOM:
        /* it must still be stored in buf */
        fprintf(out, "%*s<%s", LEVEL(level), INDENT(level), *buf);
        /* will be printed in case of some nested extension elements, we don't support that */
        close_tag = "!!error!!";
        break;
    default:
        fprintf(stderr, "Unexpected keyword \"%s\".\n", keyword2str(keyword));
        return -1;
    }

    /* keyword followed by a child element */
    if (yin_element) {
        ++level;
        fprintf(out, "%*s<%s>", LEVEL(level), INDENT(level), yin_element);
    }

    /* keyword argument */
    switch (arg) {
    case Y_IDENTIF_ARG:
        word = get_word(in, buf, buf_len);
        if (!word) {
            return -1;
        }

        /* word is the identifier (after some changes) */
        fprintf(out, "%s%s", word, (yin_element ? "" : "\""));
        break;

    case Y_STR_ARG:
        word = get_word(in, buf, buf_len);
        if (!word) {
            return -1;
        }
        /* word is the string */
        if (yin_element) {
            print_text_xml_encode(out, word);
        } else {
            print_attr_val_xml_encode(out, word);
        }

        if (!yin_element) {
            fprintf(out, "\"");
        }
        break;

    case Y_NO_ARG:
        break;
    }

    if (yin_element) {
        fprintf(out, "</%s>\n", yin_element);
        --level;
    }

    word = get_word(in, buf, buf_len);
    if (!word) {
        return -1;
    }
    keyword = get_keyword(word, &arg);
    if (!keyword) {
        fprintf(stderr, "Unexpected characters (\"%.20s\"...).\n", word);
        return -1;
    }

    if (keyword == YANG_LEFT_BRACE) {
        if (!yin_element) {
            fprintf(out, ">\n");
        }

        while (1) {
            word = get_word(in, buf, buf_len);
            if (!word) {
                return -1;
            }
            keyword = get_keyword(word, &arg);
            if (!keyword) {
                fprintf(stderr, "Unexpected characters (\"%.20s\"...).\n", word);
                return -1;
            }

            if (keyword == YANG_RIGHT_BRACE) {
                break;
            }

            if (print_keyword(keyword, arg, out, level + 1, in, buf, buf_len)) {
                return -1;
            }
        }

        fprintf(out, "%*s</%s>\n", LEVEL(level), INDENT(level), close_tag);
    }
    if ((keyword != YANG_SEMICOLON) && (keyword != YANG_RIGHT_BRACE)) {
        fprintf(stderr, "Unexpected keyword \"%s\".\n", keyword2str(keyword));
        return -1;
    }
    if (keyword == YANG_SEMICOLON) {
        if (yin_element) {
            fprintf(out, "%*s</%s>\n", LEVEL(level), INDENT(level), close_tag);
        } else {
            fprintf(out, "/>\n");
        }
    }

    return 0;
}